

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b3lyp.c
# Opt level: O0

void mcm1_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double p6;
  double p5;
  double p4;
  double p3;
  double p2;
  double p1;
  
  dVar1 = get_ext_param(in_RDI,in_RSI,0);
  dVar2 = get_ext_param(in_RDI,in_RSI,1);
  dVar3 = get_ext_param(in_RDI,in_RSI,2);
  dVar4 = get_ext_param(in_RDI,in_RSI,3);
  dVar5 = get_ext_param(in_RDI,in_RSI,4);
  dVar6 = get_ext_param(in_RDI,in_RSI,5);
  *in_RDI->mix_coef = dVar1 * (dVar4 - dVar3);
  in_RDI->mix_coef[1] = dVar1 * dVar3;
  in_RDI->mix_coef[2] = dVar6 - dVar5;
  in_RDI->mix_coef[3] = dVar5;
  in_RDI->cam_alpha = dVar2;
  return;
}

Assistant:

static void
mcm1_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double p1, p2, p3, p4, p5, p6;

  assert(p != NULL);

  p1 = get_ext_param(p, ext_params, 0);
  p2 = get_ext_param(p, ext_params, 1);
  p3 = get_ext_param(p, ext_params, 2);
  p4 = get_ext_param(p, ext_params, 3);
  p5 = get_ext_param(p, ext_params, 4);
  p6 = get_ext_param(p, ext_params, 5);

  p->mix_coef[0] = p1*(p4 - p3);
  p->mix_coef[1] = p1*p3;
  p->mix_coef[2] = p6 - p5;
  p->mix_coef[3] = p5;

  p->cam_alpha = p2;
}